

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O1

bool __thiscall tinygltf::BufferView::operator==(BufferView *this,BufferView *other)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  
  if (this->buffer != other->buffer) {
    return false;
  }
  if (((((this->byteLength == other->byteLength) && (this->byteOffset == other->byteOffset)) &&
       (this->byteStride == other->byteStride)) &&
      (__n = (this->name)._M_string_length, __n == (other->name)._M_string_length)) &&
     ((((__n == 0 ||
        (iVar2 = bcmp((this->name)._M_dataplus._M_p,(other->name)._M_dataplus._M_p,__n), iVar2 == 0)
        ) && ((this->target == other->target &&
              (((this->extensions)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
                (other->extensions)._M_t._M_impl.super__Rb_tree_header._M_node_count &&
               (bVar1 = std::__equal<false>::
                        equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,tinygltf::Value>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,tinygltf::Value>>>
                                  ((this->extensions)._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_left,(_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>
                                            )&(this->extensions)._M_t._M_impl.super__Rb_tree_header,
                                   (other->extensions)._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_left), bVar1)))))) &&
      (bVar1 = Equals(&this->extras,&other->extras), bVar1)))) {
    return this->dracoDecoded == other->dracoDecoded;
  }
  return false;
}

Assistant:

bool BufferView::operator==(const BufferView &other) const {
  return this->buffer == other.buffer && this->byteLength == other.byteLength &&
         this->byteOffset == other.byteOffset &&
         this->byteStride == other.byteStride && this->name == other.name &&
         this->target == other.target && this->extensions == other.extensions &&
         this->extras == other.extras &&
         this->dracoDecoded == other.dracoDecoded;
}